

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

Error __thiscall miniros::MasterLink::initParam(MasterLink *this,M_string *remappings)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ulong uVar4;
  char *pcVar5;
  element_type *this_00;
  socklen_t __len;
  undefined8 in_RCX;
  char *in_RDI;
  invalid_argument *anon_var_0_2;
  out_of_range *anon_var_0_3;
  double d;
  invalid_argument *anon_var_0;
  out_of_range *anon_var_0_1;
  int i;
  bool success;
  string local_name;
  string *param;
  string *name;
  const_iterator end;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe08;
  sockaddr *__addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  anon_class_8_1_8991fb9c *__f;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  undefined8 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  allocator<char> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  sockaddr local_1a8 [2];
  undefined8 local_181;
  undefined4 local_c4;
  string local_b0 [36];
  int local_8c;
  undefined1 local_85;
  allocator<char> local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  pointer local_30;
  _Self local_28;
  _Self local_20 [3];
  Error local_4;
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_fffffffffffffe08);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffe08);
  while( true ) {
    bVar1 = std::operator!=(local_20,&local_28);
    __len = (socklen_t)in_RCX;
    if (!bVar1) break;
    local_30 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x45e7c9);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x45e7de);
    local_38 = &ppVar3->second;
    uVar4 = std::__cxx11::string::size();
    if (((1 < uVar4) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar5 == '_')) &&
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar5 != '_')) {
      in_stack_fffffffffffffe40 = local_78;
      in_RCX = 0xffffffffffffffff;
      std::__cxx11::string::substr((ulong)in_stack_fffffffffffffe40,(ulong)local_30);
      std::operator+((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::__cxx11::string::~string((string *)local_78);
      local_85 = 0;
      iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffe10,(size_t *)in_stack_fffffffffffffe08,0);
      local_8c = iVar2;
      names::resolve(in_stack_fffffffffffffe18,SUB81((ulong)in_stack_fffffffffffffe10 >> 0x38,0));
      set((MasterLink *)in_stack_fffffffffffffe40,
          (string *)CONCAT44(iVar2,in_stack_fffffffffffffe38),
          (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      std::__cxx11::string::~string(local_b0);
      local_85 = 1;
      local_c4 = 4;
      std::__cxx11::string::~string(local_58);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe10);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(*(__shared_ptr **)in_RDI);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x45edb3);
    __f = (anon_class_8_1_8991fb9c *)&local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe50,in_RDI,in_stack_fffffffffffffe40);
    __addr = local_1a8;
    std::function<void(XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&)>::
    function<miniros::MasterLink::initParam(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__0,void>
              ((function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)> *)
               CONCAT17(in_stack_fffffffffffffe27,
                        CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),__f);
    RPCManager::bind(this_00,(int)&local_181 + 1,__addr,__len);
    std::function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)>::~function
              ((function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)> *)0x45ee1b);
    std::__cxx11::string::~string((string *)((long)&local_181 + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  Error::Error(&local_4,Ok);
  return (Error)local_4.code;
}

Assistant:

Error MasterLink::initParam(const M_string& remappings)
{
  auto it = remappings.begin();
  auto end = remappings.end();
  for (; it != end; ++it) {
    const std::string& name = it->first;
    const std::string& param = it->second;

    if (name.size() < 2) {
      continue;
    }

    if (name[0] == '_' && name[1] != '_') {
      std::string local_name = "~" + name.substr(1);

      bool success = false;

      try {
        auto i = std::stoi(param);
        this->set(names::resolve(local_name), i);
        success = true;
      } catch (std::invalid_argument&) {
      } catch (std::out_of_range&) {
      }

      if (success) {
        continue;
      }

      try {
        double d = std::stod(param);
        this->set(names::resolve(local_name), d);
        success = true;
      } catch (std::invalid_argument&) {
      } catch (std::out_of_range&) {
      }

      if (success) {
        continue;
      }

      if (param == "true" || param == "True" || param == "TRUE") {
        this->set(names::resolve(local_name), true);
      } else if (param == "false" || param == "False" || param == "FALSE") {
        this->set(names::resolve(local_name), false);
      } else {
        this->set(names::resolve(local_name), param);
      }
    }
  }

  if (internal_->rpcManager) {
    internal_->rpcManager->bind("paramUpdate",
      [this](const RpcValue& params, RpcValue& result) {
        return paramUpdateCallback(params, result);
      });
  }
  return Error::Ok;
}